

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O0

void av1_block_yrd(MACROBLOCK *x,RD_STATS *this_rdc,int *skippable,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  int16_t *piVar1;
  int iVar2;
  uint16_t *src_diff_00;
  int64_t iVar3;
  byte in_CL;
  uint *in_RDX;
  int *in_RSI;
  long *in_RDI;
  byte in_R8B;
  int block_offset;
  int16_t *src_diff;
  int s;
  int c;
  int r;
  tran_low_t *dqcoeff;
  tran_low_t *qcoeff;
  tran_low_t *coeff;
  int diff_stride;
  int16_t *low_dqcoeff;
  int16_t *low_qcoeff;
  int16_t *low_coeff;
  uint16_t eob [1];
  tran_low_t coeff_buf [256];
  tran_low_t qcoeff_buf [256];
  tran_low_t dqcoeff_buf [256];
  SCAN_ORDER *scan_order;
  int is_tx_8x8_dual_applicable;
  int temp_skippable;
  int num_blk_skip_w;
  int use_hbd;
  int bh;
  int bw;
  int eob_cost;
  int max_blocks_high;
  int max_blocks_wide;
  int block;
  int row_step;
  int block_step;
  int step;
  int num_4x4_h;
  int num_4x4_w;
  macroblock_plane *p;
  macroblockd_plane *pd;
  MACROBLOCKD *xd;
  int64_t dummy;
  int is_txfm_skip;
  MACROBLOCKD *xd_1;
  int is_txfm_skip_1;
  tran_low_t *src_stride;
  uint16_t *in_stack_fffffffffffff198;
  int16_t *in_stack_fffffffffffff1a0;
  int16_t *in_stack_fffffffffffff1a8;
  undefined4 in_stack_fffffffffffff1b0;
  int in_stack_fffffffffffff1b4;
  int in_stack_fffffffffffff1b8;
  int in_stack_fffffffffffff1bc;
  int in_stack_fffffffffffff1c0;
  int in_stack_fffffffffffff1c4;
  undefined4 in_stack_fffffffffffff1c8;
  undefined4 in_stack_fffffffffffff1cc;
  undefined4 in_stack_fffffffffffff1d0;
  int iVar4;
  int local_e24;
  int local_e0c;
  int local_e08;
  int local_e04;
  tran_low_t *local_dd0;
  ushort local_dc2;
  tran_low_t local_dc0 [256];
  tran_low_t local_9c0 [256];
  uint16_t local_5c0 [532];
  SCAN_ORDER (*local_198) [16];
  uint local_18c;
  uint local_188;
  uint local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  uint local_158;
  uint local_154;
  long *local_150;
  long *local_148;
  MACROBLOCKD *local_140;
  byte local_132;
  byte local_131;
  uint *local_130;
  int *local_128;
  long *local_120;
  int64_t local_118;
  uint local_10c;
  long *local_108;
  int local_fc;
  int *local_f8;
  int *local_f0;
  uint16_t *local_e8;
  tran_low_t *local_e0;
  tran_low_t *local_d8;
  uint local_d0;
  int local_cc;
  uint *local_c8;
  long *local_c0;
  uint local_b8;
  int local_b4;
  int *local_b0;
  int *local_a8;
  uint16_t *local_a0;
  tran_low_t *local_98;
  tran_low_t *local_90;
  uint local_88;
  int local_84;
  uint *local_80;
  long *local_78;
  
  local_140 = (MACROBLOCKD *)(in_RDI + 0x34);
  local_148 = in_RDI + 0x36;
  local_154 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [in_CL];
  local_158 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [in_CL];
  local_15c = 1 << ((in_R8B & 0xf) << 1);
  local_160 = 1 << (in_R8B & 0x1f);
  local_164 = (int)(local_15c * local_154) >> (in_R8B & 0x1f);
  local_168 = 0;
  if ((int)in_RDI[0x413] < 0) {
    local_e24 = (int)in_RDI[0x413] >> 5;
  }
  else {
    local_e24 = 0;
  }
  local_16c = local_154 + local_e24;
  if ((int)in_RDI[0x414] < 0) {
    iVar4 = (int)in_RDI[0x414] >> 5;
  }
  else {
    iVar4 = 0;
  }
  local_170 = local_158 + iVar4;
  local_174 = 0;
  local_178 = local_154 << 2;
  local_17c = local_158 << 2;
  local_150 = in_RDI;
  local_132 = in_R8B;
  local_131 = in_CL;
  local_130 = in_RDX;
  local_128 = in_RSI;
  local_120 = in_RDI;
  local_180 = is_cur_buf_hbd(local_140);
  local_184 = local_154;
  if (local_180 == 0) {
    src_stride = (tran_low_t *)local_148[2];
    src_diff_00 = (uint16_t *)(long)(int)local_148[5];
    (*aom_subtract_block)
              (local_17c,local_178,(int16_t *)*local_150,(long)local_178,(uint8_t *)local_150[6],
               (long)(int)local_150[9],(uint8_t *)src_stride,(ptrdiff_t)src_diff_00);
  }
  else {
    src_stride = (tran_low_t *)local_148[2];
    src_diff_00 = (uint16_t *)(long)(int)local_148[5];
    aom_highbd_subtract_block_sse2
              (in_stack_fffffffffffff1bc,in_stack_fffffffffffff1b8,
               (int16_t *)CONCAT44(in_stack_fffffffffffff1b4,in_stack_fffffffffffff1b0),
               (ptrdiff_t)in_stack_fffffffffffff1a8,(uint8_t *)in_stack_fffffffffffff1a0,
               (ptrdiff_t)in_stack_fffffffffffff198,
               (uint8_t *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8),
               CONCAT44(iVar4,in_stack_fffffffffffff1d0));
  }
  local_188 = 1;
  local_128[2] = 0;
  local_128[3] = 0;
  *local_128 = 0;
  local_18c = 0;
  if ((local_132 == 1) && (local_18c = 0, 0xf < block_size_wide[local_131])) {
    local_18c = (uint)(7 < block_size_high[local_131]) << 0x18;
  }
  local_18c = local_18c >> 0x18;
  if (local_180 != 0) {
    local_18c = 0;
  }
  if (local_18c != 0) {
    aom_process_hadamard_lp_8x16
              ((MACROBLOCK *)CONCAT44(in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c8),
               in_stack_fffffffffffff1c4,in_stack_fffffffffffff1c0,in_stack_fffffffffffff1bc,
               in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b4);
  }
  iVar4 = local_178;
  local_198 = av1_scan_orders + local_132;
  local_dd0 = local_dc0;
  for (local_e04 = 0; local_e04 < local_170; local_e04 = local_160 + local_e04) {
    local_e0c = 0;
    for (local_e08 = 0; local_e08 < local_16c; local_e08 = local_160 + local_e08) {
      piVar1 = (int16_t *)(*local_150 + (long)((local_e04 * iVar4 + local_e08) * 4) * 2);
      if (local_132 == 1) {
        if (local_180 == 0) {
          if (local_18c == 0) {
            aom_hadamard_lp_8x8_sse2
                      ((int16_t *)src_diff_00,(ptrdiff_t)src_stride,(int16_t *)0x61a353);
          }
          else {
            local_dd0 = (tran_low_t *)(local_150[3] + (long)((local_168 + local_e0c) * 0x10) * 2);
          }
          src_stride = (tran_low_t *)local_150[0x10];
          src_diff_00 = &local_dc2;
          in_stack_fffffffffffff198 = (uint16_t *)0x0;
          (*av1_quantize_lp)((int16_t *)local_dd0,0x40,(int16_t *)local_150[0xb],
                             (int16_t *)local_150[10],(int16_t *)local_9c0,(int16_t *)local_5c0,
                             (int16_t *)src_stride,src_diff_00,default_scan_8x8_transpose,
                             av1_default_iscan_8x8_transpose);
        }
        else {
          aom_hadamard_8x8_sse2((int16_t *)src_diff_00,(ptrdiff_t)src_stride,(tran_low_t *)0x61a25c)
          ;
          in_stack_fffffffffffff198 = &local_dc2;
          in_stack_fffffffffffff1a0 = default_scan_8x8_transpose;
          in_stack_fffffffffffff1a8 = av1_default_iscan_8x8_transpose;
          src_stride = local_9c0;
          src_diff_00 = local_5c0;
          (*av1_quantize_fp)(local_dc0,0x40,(int16_t *)local_150[0xf],(int16_t *)local_150[0xb],
                             (int16_t *)local_150[10],(int16_t *)local_150[0xe],local_9c0,
                             (tran_low_t *)local_5c0,(int16_t *)local_150[0x10],
                             in_stack_fffffffffffff198,default_scan_8x8_transpose,
                             av1_default_iscan_8x8_transpose);
        }
      }
      else if (local_132 == 2) {
        if (local_180 == 0) {
          (*aom_hadamard_lp_16x16)(piVar1,(long)iVar4,(int16_t *)local_dd0);
          src_stride = (tran_low_t *)local_150[0x10];
          src_diff_00 = &local_dc2;
          in_stack_fffffffffffff198 = (uint16_t *)0x0;
          (*av1_quantize_lp)((int16_t *)local_dd0,0x100,(int16_t *)local_150[0xb],
                             (int16_t *)local_150[10],(int16_t *)local_9c0,(int16_t *)local_5c0,
                             (int16_t *)src_stride,src_diff_00,default_scan_lp_16x16_transpose,
                             av1_default_iscan_lp_16x16_transpose);
        }
        else {
          (*aom_hadamard_16x16)(piVar1,(long)iVar4,local_dc0);
          in_stack_fffffffffffff198 = &local_dc2;
          in_stack_fffffffffffff1a0 = default_scan_fp_16x16_transpose;
          in_stack_fffffffffffff1a8 = av1_default_iscan_fp_16x16_transpose;
          src_stride = local_9c0;
          src_diff_00 = local_5c0;
          (*av1_quantize_fp)(local_dc0,0x100,(int16_t *)local_150[0xf],(int16_t *)local_150[0xb],
                             (int16_t *)local_150[10],(int16_t *)local_150[0xe],local_9c0,
                             (tran_low_t *)local_5c0,(int16_t *)local_150[0x10],
                             in_stack_fffffffffffff198,default_scan_fp_16x16_transpose,
                             av1_default_iscan_fp_16x16_transpose);
        }
      }
      else if (local_180 == 0) {
        aom_fdct4x4_lp_sse2((int16_t *)CONCAT44(in_stack_fffffffffffff1b4,in_stack_fffffffffffff1b0)
                            ,in_stack_fffffffffffff1a8,
                            (int)((ulong)in_stack_fffffffffffff1a0 >> 0x20));
        src_stride = (tran_low_t *)local_150[0x10];
        src_diff_00 = &local_dc2;
        in_stack_fffffffffffff198 = (uint16_t *)(*local_198)[0].iscan;
        (*av1_quantize_lp)((int16_t *)local_dd0,0x10,(int16_t *)local_150[0xb],
                           (int16_t *)local_150[10],(int16_t *)local_9c0,(int16_t *)local_5c0,
                           (int16_t *)src_stride,src_diff_00,(*local_198)[0].scan,
                           (int16_t *)in_stack_fffffffffffff198);
      }
      else {
        aom_fdct4x4_sse2(in_stack_fffffffffffff1a8,(tran_low_t *)in_stack_fffffffffffff1a0,
                         (int)((ulong)in_stack_fffffffffffff198 >> 0x20));
        in_stack_fffffffffffff198 = &local_dc2;
        in_stack_fffffffffffff1a0 = (*local_198)[0].scan;
        in_stack_fffffffffffff1a8 = (*local_198)[0].iscan;
        src_stride = local_9c0;
        src_diff_00 = local_5c0;
        (*av1_quantize_fp)(local_dc0,0x10,(int16_t *)local_150[0xf],(int16_t *)local_150[0xb],
                           (int16_t *)local_150[10],(int16_t *)local_150[0xe],local_9c0,
                           (tran_low_t *)local_5c0,(int16_t *)local_150[0x10],
                           in_stack_fffffffffffff198,in_stack_fffffffffffff1a0,
                           in_stack_fffffffffffff1a8);
      }
      if (local_180 == 0) {
        local_b4 = local_e04 * local_184 + local_e08;
        local_78 = local_120;
        local_80 = &local_188;
        local_84 = local_15c;
        local_88 = (uint)local_dc2;
        local_90 = local_dd0;
        local_a8 = local_128;
        local_b0 = &local_174;
        local_b8 = (uint)(local_88 == 0);
        local_188 = local_b8 & local_188;
        *(bool *)((long)local_120 + (long)local_b4 + 0x24e09) = local_88 == 0;
        local_a0 = local_5c0;
        local_98 = local_9c0;
        iVar2 = get_msb(local_88 + 1);
        *local_b0 = iVar2 + *local_b0;
        if (local_88 == 1) {
          iVar2 = (int)(short)*local_98;
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          *local_a8 = iVar2 + *local_a8;
        }
        else if (1 < (int)local_88) {
          iVar2 = (*aom_satd_lp)((int16_t *)local_98,local_84 << 4);
          *local_a8 = iVar2 + *local_a8;
        }
        iVar3 = (*av1_block_error_lp)((int16_t *)local_90,(int16_t *)local_a0,(long)(local_84 << 4))
        ;
        *(int64_t *)(local_a8 + 2) = (iVar3 >> 2) + *(long *)(local_a8 + 2);
      }
      else {
        local_fc = local_e04 * local_184 + local_e08;
        local_c0 = local_120;
        local_c8 = &local_188;
        local_cc = local_15c;
        local_d0 = (uint)local_dc2;
        local_f0 = local_128;
        local_f8 = &local_174;
        local_108 = local_120 + 0x34;
        local_10c = (uint)(local_d0 == 0);
        local_188 = local_10c & local_188;
        *(bool *)((long)local_120 + (long)local_fc + 0x24e09) = local_d0 == 0;
        local_e8 = local_5c0;
        local_e0 = local_9c0;
        local_d8 = local_dc0;
        iVar2 = get_msb(local_d0 + 1);
        *local_f8 = iVar2 + *local_f8;
        if (local_d0 == 1) {
          iVar2 = *local_e0;
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          *local_f0 = iVar2 + *local_f0;
        }
        else if (1 < (int)local_d0) {
          iVar2 = (*aom_satd)(local_e0,local_cc << 4);
          *local_f0 = iVar2 + *local_f0;
        }
        iVar3 = (*av1_highbd_block_error)
                          (local_d8,(tran_low_t *)local_e8,(long)(local_cc << 4),&local_118,
                           (int)local_108[0x534]);
        *(int64_t *)(local_f0 + 2) = (iVar3 >> 2) + *(long *)(local_f0 + 2);
      }
      local_e0c = local_15c + local_e0c;
    }
    local_168 = local_164 + local_168;
  }
  *local_130 = local_188;
  *(char *)(local_128 + 8) = (char)local_188;
  if ((*(long *)(local_128 + 6) < 0x7fffffffffffffff) &&
     (*(long *)(local_128 + 6) = (*(long *)(local_128 + 6) << 6) >> 2, local_188 != 0)) {
    local_128[2] = 0;
    local_128[3] = 0;
    *(undefined8 *)(local_128 + 2) = *(undefined8 *)(local_128 + 6);
  }
  else {
    *local_128 = *local_128 << 0xb;
    *local_128 = local_174 * 0x200 + *local_128;
  }
  return;
}

Assistant:

void av1_block_yrd(MACROBLOCK *x, RD_STATS *this_rdc, int *skippable,
                   BLOCK_SIZE bsize, TX_SIZE tx_size) {
  MACROBLOCKD *xd = &x->e_mbd;
  const struct macroblockd_plane *pd = &xd->plane[AOM_PLANE_Y];
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  assert(bsize < BLOCK_SIZES_ALL);
  const int num_4x4_w = mi_size_wide[bsize];
  const int num_4x4_h = mi_size_high[bsize];
  const int step = 1 << (tx_size << 1);
  const int block_step = (1 << tx_size);
  const int row_step = step * num_4x4_w >> tx_size;
  int block = 0;
  const int max_blocks_wide =
      num_4x4_w + (xd->mb_to_right_edge >= 0 ? 0 : xd->mb_to_right_edge >> 5);
  const int max_blocks_high =
      num_4x4_h + (xd->mb_to_bottom_edge >= 0 ? 0 : xd->mb_to_bottom_edge >> 5);
  int eob_cost = 0;
  const int bw = 4 * num_4x4_w;
  const int bh = 4 * num_4x4_h;
  const int use_hbd = is_cur_buf_hbd(xd);
  int num_blk_skip_w = num_4x4_w;

#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd) {
    aom_highbd_subtract_block(bh, bw, p->src_diff, bw, p->src.buf,
                              p->src.stride, pd->dst.buf, pd->dst.stride);
  } else {
    aom_subtract_block(bh, bw, p->src_diff, bw, p->src.buf, p->src.stride,
                       pd->dst.buf, pd->dst.stride);
  }
#else
  aom_subtract_block(bh, bw, p->src_diff, bw, p->src.buf, p->src.stride,
                     pd->dst.buf, pd->dst.stride);
#endif

  // Keep the intermediate value on the stack here. Writing directly to
  // skippable causes speed regression due to load-and-store issues in
  // update_yrd_loop_vars.
  int temp_skippable = 1;
  this_rdc->dist = 0;
  this_rdc->rate = 0;
  // For block sizes 8x16 or above, Hadamard txfm of two adjacent 8x8 blocks
  // can be done per function call. Hence the call of Hadamard txfm is
  // abstracted here for the specified cases.
  int is_tx_8x8_dual_applicable =
      (tx_size == TX_8X8 && block_size_wide[bsize] >= 16 &&
       block_size_high[bsize] >= 8);

#if CONFIG_AV1_HIGHBITDEPTH
  // As of now, dual implementation of hadamard txfm is available for low
  // bitdepth.
  if (use_hbd) is_tx_8x8_dual_applicable = 0;
#endif

  if (is_tx_8x8_dual_applicable) {
    aom_process_hadamard_lp_8x16(x, max_blocks_high, max_blocks_wide, num_4x4_w,
                                 step, block_step);
  }

  const SCAN_ORDER *const scan_order = &av1_scan_orders[tx_size][DCT_DCT];
  DECLARE_BLOCK_YRD_BUFFERS()
  DECLARE_BLOCK_YRD_VARS()
#if CONFIG_AV1_HIGHBITDEPTH
  DECLARE_BLOCK_YRD_HBD_VARS()
#else
  (void)use_hbd;
#endif

  // Keep track of the row and column of the blocks we use so that we know
  // if we are in the unrestricted motion border.
  for (int r = 0; r < max_blocks_high; r += block_step) {
    for (int c = 0, s = 0; c < max_blocks_wide; c += block_step, s += step) {
      DECLARE_LOOP_VARS_BLOCK_YRD()

      switch (tx_size) {
#if CONFIG_AV1_HIGHBITDEPTH
        case TX_16X16:
          if (use_hbd) {
            aom_hadamard_16x16(src_diff, diff_stride, coeff);
            av1_quantize_fp(coeff, 16 * 16, p->zbin_QTX, p->round_fp_QTX,
                            p->quant_fp_QTX, p->quant_shift_QTX, qcoeff,
                            dqcoeff, p->dequant_QTX, eob,
                            // default_scan_fp_16x16_transpose and
                            // av1_default_iscan_fp_16x16_transpose have to be
                            // used together.
                            default_scan_fp_16x16_transpose,
                            av1_default_iscan_fp_16x16_transpose);
          } else {
            aom_hadamard_lp_16x16(src_diff, diff_stride, low_coeff);
            av1_quantize_lp(low_coeff, 16 * 16, p->round_fp_QTX,
                            p->quant_fp_QTX, low_qcoeff, low_dqcoeff,
                            p->dequant_QTX, eob,
                            // default_scan_lp_16x16_transpose and
                            // av1_default_iscan_lp_16x16_transpose have to be
                            // used together.
                            default_scan_lp_16x16_transpose,
                            av1_default_iscan_lp_16x16_transpose);
          }
          break;
        case TX_8X8:
          if (use_hbd) {
            aom_hadamard_8x8(src_diff, diff_stride, coeff);
            av1_quantize_fp(
                coeff, 8 * 8, p->zbin_QTX, p->round_fp_QTX, p->quant_fp_QTX,
                p->quant_shift_QTX, qcoeff, dqcoeff, p->dequant_QTX, eob,
                default_scan_8x8_transpose, av1_default_iscan_8x8_transpose);
          } else {
            if (is_tx_8x8_dual_applicable) {
              // The coeffs are pre-computed for the whole block, so re-assign
              // low_coeff to the appropriate location.
              const int block_offset = BLOCK_OFFSET(block + s);
              low_coeff = (int16_t *)p->coeff + block_offset;
            } else {
              aom_hadamard_lp_8x8(src_diff, diff_stride, low_coeff);
            }
            av1_quantize_lp(
                low_coeff, 8 * 8, p->round_fp_QTX, p->quant_fp_QTX, low_qcoeff,
                low_dqcoeff, p->dequant_QTX, eob,
                // default_scan_8x8_transpose and
                // av1_default_iscan_8x8_transpose have to be used together.
                default_scan_8x8_transpose, av1_default_iscan_8x8_transpose);
          }
          break;
        default:
          assert(tx_size == TX_4X4);
          // In tx_size=4x4 case, aom_fdct4x4 and aom_fdct4x4_lp generate
          // normal coefficients order, so we don't need to change the scan
          // order here.
          if (use_hbd) {
            aom_fdct4x4(src_diff, coeff, diff_stride);
            av1_quantize_fp(coeff, 4 * 4, p->zbin_QTX, p->round_fp_QTX,
                            p->quant_fp_QTX, p->quant_shift_QTX, qcoeff,
                            dqcoeff, p->dequant_QTX, eob, scan_order->scan,
                            scan_order->iscan);
          } else {
            aom_fdct4x4_lp(src_diff, low_coeff, diff_stride);
            av1_quantize_lp(low_coeff, 4 * 4, p->round_fp_QTX, p->quant_fp_QTX,
                            low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                            scan_order->scan, scan_order->iscan);
          }
          break;
#else
        case TX_16X16:
          aom_hadamard_lp_16x16(src_diff, diff_stride, low_coeff);
          av1_quantize_lp(low_coeff, 16 * 16, p->round_fp_QTX, p->quant_fp_QTX,
                          low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                          default_scan_lp_16x16_transpose,
                          av1_default_iscan_lp_16x16_transpose);
          break;
        case TX_8X8:
          if (is_tx_8x8_dual_applicable) {
            // The coeffs are pre-computed for the whole block, so re-assign
            // low_coeff to the appropriate location.
            const int block_offset = BLOCK_OFFSET(block + s);
            low_coeff = (int16_t *)p->coeff + block_offset;
          } else {
            aom_hadamard_lp_8x8(src_diff, diff_stride, low_coeff);
          }
          av1_quantize_lp(low_coeff, 8 * 8, p->round_fp_QTX, p->quant_fp_QTX,
                          low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                          default_scan_8x8_transpose,
                          av1_default_iscan_8x8_transpose);
          break;
        default:
          aom_fdct4x4_lp(src_diff, low_coeff, diff_stride);
          av1_quantize_lp(low_coeff, 4 * 4, p->round_fp_QTX, p->quant_fp_QTX,
                          low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                          scan_order->scan, scan_order->iscan);
          break;
#endif
      }
      assert(*eob <= 1024);
#if CONFIG_AV1_HIGHBITDEPTH
      if (use_hbd)
        update_yrd_loop_vars_hbd(x, &temp_skippable, step, *eob, coeff, qcoeff,
                                 dqcoeff, this_rdc, &eob_cost,
                                 r * num_blk_skip_w + c);
      else
#endif
        update_yrd_loop_vars(x, &temp_skippable, step, *eob, low_coeff,
                             low_qcoeff, low_dqcoeff, this_rdc, &eob_cost,
                             r * num_blk_skip_w + c);
    }
    block += row_step;
  }

  this_rdc->skip_txfm = *skippable = temp_skippable;
  if (this_rdc->sse < INT64_MAX) {
    this_rdc->sse = (this_rdc->sse << 6) >> 2;
    if (temp_skippable) {
      this_rdc->dist = 0;
      this_rdc->dist = this_rdc->sse;
      return;
    }
  }

  // If skippable is set, rate gets clobbered later.
  this_rdc->rate <<= (2 + AV1_PROB_COST_SHIFT);
  this_rdc->rate += (eob_cost << AV1_PROB_COST_SHIFT);
}